

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O3

fio_protocol_s *
fio_cluster_protocol_alloc
          (intptr_t uuid,_func_void_cluster_pr_s_ptr *handler,_func_void_void_ptr_intptr_t *sender)

{
  long lVar1;
  undefined8 *__addr;
  void *__addr_00;
  fio_protocol_s *pfVar2;
  int *piVar3;
  size_t __len;
  ulong __len_00;
  
  __addr = (undefined8 *)mmap(sys_alloc_next_alloc,0x5000,3,0x22,-1,0);
  if (__addr != (undefined8 *)0xffffffffffffffff) {
    if (((ulong)__addr & 0x7fff) != 0) {
      munmap(__addr,0x5000);
      __addr_00 = mmap((void *)0x0,0xd000,3,0x22,-1,0);
      if (__addr_00 == (void *)0xffffffffffffffff) goto LAB_0013d532;
      __len_00 = (ulong)((uint)__addr_00 & 0x7fff);
      lVar1 = -__len_00;
      __len = lVar1 + 0x8000;
      munmap(__addr_00,__len);
      __addr = (undefined8 *)((long)__addr_00 + __len);
      munmap((void *)((long)__addr_00 + lVar1 + 0xd000),__len_00);
    }
    sys_alloc_next_alloc = __addr + 0x8000000;
    if (__addr != (undefined8 *)0x0) {
      *__addr = 0x5000;
      pfVar2 = (fio_protocol_s *)(__addr + 2);
      if (pfVar2 != (fio_protocol_s *)0x0) {
        pfVar2->on_data = fio_cluster_on_data;
        __addr[3] = 0;
        __addr[4] = fio_cluster_on_shutdown;
        __addr[5] = fio_cluster_on_close;
        __addr[6] = fio_cluster_ping;
        __addr[7] = 0;
        __addr[0x17] = uuid;
        __addr[9] = handler;
        __addr[10] = sender;
        __addr[0xb] = 0;
        __addr[0xc] = 0;
        __addr[0xd] = 0;
        __addr[0xe] = 0;
        __addr[0xf] = 0;
        __addr[0x10] = 0;
        __addr[0x11] = 0;
        __addr[0x12] = 0;
        __addr[0x13] = 0;
        __addr[0x14] = 0;
        __addr[0x15] = 0;
        __addr[0x16] = 0;
        *(undefined1 *)((long)__addr + 0xd4) = 0;
        return pfVar2;
      }
    }
  }
LAB_0013d532:
  if (0 < FIO_LOG_LEVEL) {
    FIO_LOG2STDERR("FATAL: Cluster protocol allocation failed.");
  }
  piVar3 = __errno_location();
  exit(*piVar3);
}

Assistant:

static inline fio_protocol_s *
fio_cluster_protocol_alloc(intptr_t uuid,
                           void (*handler)(struct cluster_pr_s *pr),
                           void (*sender)(void *data, intptr_t auuid)) {
  cluster_pr_s *p = fio_mmap(sizeof(*p));
  if (!p) {
    FIO_LOG_FATAL("Cluster protocol allocation failed.");
    exit(errno);
  }
  p->protocol = (fio_protocol_s){
      .ping = fio_cluster_ping,
      .on_close = fio_cluster_on_close,
      .on_shutdown = fio_cluster_on_shutdown,
      .on_data = fio_cluster_on_data,
  };
  p->uuid = uuid;
  p->handler = handler;
  p->sender = sender;
  p->pubsub = (fio_sub_hash_s)FIO_SET_INIT;
  p->patterns = (fio_sub_hash_s)FIO_SET_INIT;
  p->lock = FIO_LOCK_INIT;
  return &p->protocol;
}